

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void * xmlCopyAttribute(void *payload,xmlChar *name)

{
  undefined8 *puVar1;
  xmlEnumerationPtr pxVar2;
  xmlChar *pxVar3;
  
  puVar1 = (undefined8 *)(*xmlMalloc)(0x78);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
  }
  else {
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[0xc] = 0;
    puVar1[0xd] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[0xe] = 0;
    *(undefined4 *)(puVar1 + 1) = 0x10;
    *(undefined4 *)(puVar1 + 10) = *(undefined4 *)((long)payload + 0x50);
    *(undefined4 *)((long)puVar1 + 0x54) = *(undefined4 *)((long)payload + 0x54);
    pxVar2 = xmlCopyEnumeration(*(xmlEnumerationPtr *)((long)payload + 0x60));
    puVar1[0xc] = pxVar2;
    if (*(xmlChar **)((long)payload + 0x70) != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x70));
      puVar1[0xe] = pxVar3;
    }
    if (*(xmlChar **)((long)payload + 0x10) != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      puVar1[2] = pxVar3;
    }
    if (*(xmlChar **)((long)payload + 0x68) != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
      puVar1[0xd] = pxVar3;
    }
    if (*(xmlChar **)((long)payload + 0x58) != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x58));
      puVar1[0xb] = pxVar3;
    }
  }
  return puVar1;
}

Assistant:

static void *
xmlCopyAttribute(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlAttributePtr attr = (xmlAttributePtr) payload;
    xmlAttributePtr cur;

    cur = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (cur == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlAttribute));
    cur->type = XML_ATTRIBUTE_DECL;
    cur->atype = attr->atype;
    cur->def = attr->def;
    cur->tree = xmlCopyEnumeration(attr->tree);
    if (attr->elem != NULL)
	cur->elem = xmlStrdup(attr->elem);
    if (attr->name != NULL)
	cur->name = xmlStrdup(attr->name);
    if (attr->prefix != NULL)
	cur->prefix = xmlStrdup(attr->prefix);
    if (attr->defaultValue != NULL)
	cur->defaultValue = xmlStrdup(attr->defaultValue);
    return(cur);
}